

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_u8x4.c
# Opt level: O3

void image_u8x4_write_pam(image_u8x4_t *im,char *path)

{
  FILE *__s;
  int iVar1;
  
  __s = fopen(path,"w");
  fwrite("P7\n",3,1,__s);
  iVar1 = 0;
  fprintf(__s,"WIDTH %d\n",(ulong)(uint)im->width);
  fprintf(__s,"HEIGHT %d\n",(ulong)(uint)im->height);
  fwrite("DEPTH 4\n",8,1,__s);
  fwrite("MAXVAL 255\n",0xb,1,__s);
  fwrite("TUPLTYPE RGB_ALPHA\n",0x13,1,__s);
  fwrite("ENDHDR\n",7,1,__s);
  if (0 < im->height) {
    do {
      fwrite(im->buf + (long)im->stride * (long)iVar1,1,(long)im->width << 2,__s);
      iVar1 = iVar1 + 1;
    } while (iVar1 < im->height);
  }
  fclose(__s);
  return;
}

Assistant:

void image_u8x4_write_pam(const image_u8x4_t *im, const char *path)
{
    FILE *f = fopen(path, "w");
    fprintf(f, "P7\n");
    fprintf(f, "WIDTH %d\n", im->width);
    fprintf(f, "HEIGHT %d\n", im->height);
    fprintf(f, "DEPTH 4\n");
    fprintf(f, "MAXVAL 255\n");
    fprintf(f, "TUPLTYPE RGB_ALPHA\n");
    fprintf(f, "ENDHDR\n");

    for (int y = 0; y < im->height; y++)
        fwrite(&im->buf[y*im->stride], 1, 4*im->width, f);

    fclose(f);

}